

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall kj::_::XThreadEvent::ensureDoneOrCanceled(XThreadEvent *this)

{
  uint *puVar1;
  EventLoop **ppEVar2;
  bool bVar3;
  anon_enum_32 aVar4;
  XThreadEvent *pXVar5;
  EventLoop *pEVar6;
  Maybe<kj::_::XThreadEvent_&> *pMVar7;
  EventPort *pEVar8;
  Executor *pEVar9;
  Mutex *this_00;
  XThreadEvent **ppXVar10;
  RemoveConst<kj::_::XThreadEvent_*> *ppXVar11;
  XThreadEvent **ppXVar12;
  long in_FS_OFFSET;
  PredicateImpl_conflict5 impl;
  Locked<kj::Executor::Impl::State> lock;
  Locked<kj::Executor::Impl::State> selfLock;
  Locked<kj::Executor::Impl::State> local_98;
  Vector<kj::_::XThreadEvent_*> local_88;
  XThreadEvent *local_68;
  EventLoop **local_60;
  Mutex *local_58;
  anon_union_16_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:959:11)>_2
  local_50;
  XThreadEvent *local_40;
  EventLoop **local_38;
  
  if (this->state != DONE) {
    pXVar5 = (XThreadEvent *)(((this->targetExecutor).ptr)->impl).ptr;
    local_88.builder.ptr = (XThreadEvent **)((ulong)local_88.builder.ptr & 0xffffffffffffff00);
    Mutex::lock((Mutex *)pXVar5);
    local_98.ptr = (State *)&(pXVar5->super_Event).loop;
    pEVar6 = (pXVar5->super_Event).loop;
    local_98.mutex = (Mutex *)pXVar5;
    if (pEVar6 == (EventLoop *)0x0) {
      local_88.builder.pos = &local_68;
      local_88.builder.ptr = (XThreadEvent **)&PTR_check_006206f0;
      local_58 = (Mutex *)((ulong)local_58 & 0xffffffffffffff00);
      local_88.builder.endPtr = (XThreadEvent **)local_98.ptr;
      local_68 = this;
      Mutex::wait((Mutex *)pXVar5,&local_88);
    }
    else {
      aVar4 = this->state;
      if (aVar4 == QUEUED) {
        List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::remove
                  ((List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink> *)
                   &(pXVar5->super_Event).next,(char *)this);
        this->state = DONE;
      }
      else if (aVar4 == EXECUTING) {
        List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::remove
                  ((List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink> *)
                   &(pXVar5->targetExecutor).ptr,(char *)this);
        if ((this->targetLink).prev != (Maybe<kj::_::XThreadEvent_&> *)0x0) {
          throwDoubleAdd();
        }
        pMVar7 = (Maybe<kj::_::XThreadEvent_&> *)
                 ((SourceLocation *)&(local_98.ptr)->cancel)->function;
        pMVar7->ptr = this;
        (this->targetLink).prev = pMVar7;
        ((SourceLocation *)&(local_98.ptr)->cancel)->function = (char *)&this->targetLink;
        puVar1 = &((SourceLocation *)&(local_98.ptr)->cancel)->lineNumber;
        *(long *)puVar1 = *(long *)puVar1 + 1;
        this->state = CANCELING;
        pEVar8 = (pEVar6->port).ptr;
        if (pEVar8 != (EventPort *)0x0) {
          (*pEVar8->_vptr_EventPort[3])();
        }
        if ((*(long *)(in_FS_OFFSET + -0x28) == 0) ||
           (pEVar9 = *(Executor **)(*(long *)(in_FS_OFFSET + -0x28) + 0x48),
           pEVar9 == (Executor *)0x0)) {
          local_88.builder.pos = &local_68;
          local_88.builder.ptr = (XThreadEvent **)&PTR_check_00620750;
          local_88.builder.endPtr = (XThreadEvent **)local_98.ptr;
          local_58 = (Mutex *)((ulong)local_58._1_7_ << 8);
          local_68 = this;
          Mutex::wait(local_98.mutex,&local_88);
        }
        else {
          local_58 = (Mutex *)CONCAT71(local_58._1_7_,1);
          local_50.value.lock = &local_98;
          local_50.value.selfExecutor = pEVar9;
          if (this->state != DONE) {
            do {
              bVar3 = (local_98.ptr)->waitingForCancel;
              local_88.builder.ptr = (XThreadEvent **)0x0;
              local_88.builder.pos = (RemoveConst<kj::_::XThreadEvent_*> *)0x0;
              if ((XThreadEvent *)local_98.mutex != (XThreadEvent *)0x0) {
                Mutex::unlock(local_98.mutex,EXCLUSIVE,(Waiter *)0x0);
              }
              local_98.mutex = (Mutex *)0x0;
              local_98.ptr = (State *)0x0;
              local_88.builder.ptr = (XThreadEvent **)0x0;
              local_88.builder.pos = (RemoveConst<kj::_::XThreadEvent_*> *)0x0;
              local_88.builder.endPtr = (XThreadEvent **)0x0;
              local_88.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
              pXVar5 = (XThreadEvent *)(pEVar9->impl).ptr;
              local_68 = (XThreadEvent *)((ulong)local_68 & 0xffffffffffffff00);
              Mutex::lock((Mutex *)pXVar5,0,&local_68);
              local_38 = &(pXVar5->super_Event).loop;
              *(undefined1 *)&(pXVar5->replyLink).next.ptr = 1;
              local_40 = pXVar5;
              Executor::Impl::State::dispatchCancels((State *)local_38,&local_88);
              Mutex::unlock((Mutex *)pXVar5,EXCLUSIVE,(Waiter *)0x0);
              Executor::Impl::processAsyncCancellations((pEVar9->impl).ptr,&local_88);
              ppXVar12 = local_88.builder.endPtr;
              ppXVar11 = local_88.builder.pos;
              ppXVar10 = local_88.builder.ptr;
              if (local_88.builder.ptr != (XThreadEvent **)0x0) {
                local_88.builder.ptr = (XThreadEvent **)0x0;
                local_88.builder.pos = (RemoveConst<kj::_::XThreadEvent_*> *)0x0;
                local_88.builder.endPtr = (XThreadEvent **)0x0;
                (**(local_88.builder.disposer)->_vptr_ArrayDisposer)
                          (local_88.builder.disposer,ppXVar10,8,(long)ppXVar11 - (long)ppXVar10 >> 3
                           ,(long)ppXVar12 - (long)ppXVar10 >> 3,0);
              }
              if (bVar3 != false) {
                sched_yield();
              }
              pXVar5 = (XThreadEvent *)(((this->targetExecutor).ptr)->impl).ptr;
              local_88.builder.ptr =
                   (XThreadEvent **)((ulong)local_88.builder.ptr & 0xffffffffffffff00);
              Mutex::lock((Mutex *)pXVar5,0,&local_88);
              ppEVar2 = &(pXVar5->super_Event).loop;
              local_68 = pXVar5;
              local_60 = ppEVar2;
              if (local_98.mutex != (Mutex *)0x0) {
                Mutex::unlock(local_98.mutex,EXCLUSIVE,(Waiter *)0x0);
              }
              local_88.builder.ptr = (XThreadEvent **)&PTR_check_00620720;
              local_88.builder.pos = &local_40;
              local_68 = (XThreadEvent *)((ulong)local_68 & 0xffffffffffffff00);
              local_98.mutex = (Mutex *)pXVar5;
              local_98.ptr = (State *)ppEVar2;
              local_88.builder.endPtr = (XThreadEvent **)ppEVar2;
              local_40 = this;
              Mutex::wait((Mutex *)pXVar5,&local_88);
            } while (this->state != DONE);
          }
          Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:959:11)>
          ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:959:11)>
                       *)&local_58);
        }
      }
      else if (aVar4 == CANCELING) {
        Debug::Fault::Fault<kj::Exception::Type,char_const(&)[69]>
                  ((Fault *)&local_88,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                   ,0x403,FAILED,(char *)0x0,
                   "\"impossible state: CANCELING should only be set within the above case\"",
                   (char (*) [69])
                   "impossible state: CANCELING should only be set within the above case");
        Debug::Fault::fatal((Fault *)&local_88);
      }
    }
    if ((XThreadEvent *)local_98.mutex != (XThreadEvent *)0x0) {
      Mutex::unlock(local_98.mutex,EXCLUSIVE,(Waiter *)0x0);
    }
    if (pEVar6 == (EventLoop *)0x0) {
      return;
    }
  }
  pEVar9 = (this->replyExecutor).ptr;
  if ((pEVar9 != (Executor *)0x0) && ((this->replyLink).prev != (Maybe<kj::_::XThreadEvent_&> *)0x0)
     ) {
    this_00 = (Mutex *)(pEVar9->impl).ptr;
    local_88.builder.ptr = (XThreadEvent **)((ulong)local_88.builder.ptr & 0xffffffffffffff00);
    Mutex::lock(this_00,0);
    local_50.value.lock = (Locked<kj::Executor::Impl::State> *)(this_00 + 1);
    local_58 = this_00;
    List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::replyLink>::remove
              ((List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::replyLink> *)&this_00[3].waitersHead
               ,(char *)this);
    Mutex::unlock(this_00,EXCLUSIVE,(Waiter *)0x0);
  }
  return;
}

Assistant:

void XThreadEvent::ensureDoneOrCanceled() {
  if (__atomic_load_n(&state, __ATOMIC_ACQUIRE) != DONE) {
    auto lock = targetExecutor->impl->state.lockExclusive();

    const EventLoop* loop;
    KJ_IF_SOME(l, lock->loop) {
      loop = &l;
    } else {
      // Target event loop is already dead, so we know it's already working on transitioning all
      // events to the DONE state. We can just wait.
      lock.wait([&](auto&) { return state == DONE; });
      return;
    }

    switch (state) {
      case UNUSED:
        // Nothing to do.
        break;
      case QUEUED:
        lock->start.remove(*this);
        // No wake needed since we removed work rather than adding it.
        state = DONE;
        break;
      case EXECUTING: {
        lock->executing.remove(*this);
        lock->cancel.add(*this);
        state = CANCELING;
        KJ_IF_SOME(p, loop->port) {
          p.wake();
        }

        Maybe<Executor&> maybeSelfExecutor = kj::none;
        if (threadLocalEventLoop != nullptr) {
          KJ_IF_SOME(e, threadLocalEventLoop->executor) {
            maybeSelfExecutor = *e;
          }
        }

        KJ_IF_SOME(selfExecutor, maybeSelfExecutor) {
          // If, while waiting for other threads to process our cancellation request, we have
          // cancellation requests queued back to this thread, we must process them. Otherwise,
          // we could deadlock with two threads waiting on each other to process cancellations.
          //
          // We don't have a terribly good way to detect this, except to check if the remote
          // thread is itself waiting for cancellations and, if so, wake ourselves up to check for
          // cancellations to process. This will busy-loop but at least it should eventually
          // resolve assuming fair scheduling.
          //
          // To make things extra-annoying, in order to update our waitingForCancel flag, we have
          // to lock our own executor state, but we can't take both locks at once, so we have to
          // release the other lock in the meantime.

          // Make sure we unset waitingForCancel on the way out.
          KJ_DEFER({
            lock = {};

            Vector<_::XThreadEvent*> eventsToCancelOutsideLock;
            KJ_DEFER(selfExecutor.impl->processAsyncCancellations(eventsToCancelOutsideLock));

            auto selfLock = selfExecutor.impl->state.lockExclusive();
            selfLock->waitingForCancel = false;
            selfLock->dispatchCancels(eventsToCancelOutsideLock);

            // We don't need to re-take the lock on the other executor here; it's not used again
            // after this scope.
          });

          while (state != DONE) {
            bool otherThreadIsWaiting = lock->waitingForCancel;

            // Make sure our waitingForCancel is on and dispatch any pending cancellations on this
            // thread.
            lock = {};
            {
              Vector<_::XThreadEvent*> eventsToCancelOutsideLock;
              KJ_DEFER(selfExecutor.impl->processAsyncCancellations(eventsToCancelOutsideLock));

              auto selfLock = selfExecutor.impl->state.lockExclusive();
              selfLock->waitingForCancel = true;

              // Note that we don't have to proactively delete the PromiseNodes extracted from
              // the canceled events because those nodes belong to this thread and can't possibly
              // continue executing while we're blocked here.
              selfLock->dispatchCancels(eventsToCancelOutsideLock);
            }

            if (otherThreadIsWaiting) {
              // We know the other thread was waiting for cancellations to complete a moment ago.
              // We may have just processed the necessary cancellations in this thread, in which
              // case the other thread needs a chance to receive control and notice this. Or, it
              // may be that the other thread is waiting for some third thread to take action.
              // Either way, we should yield control here to give things a chance to settle.
              // Otherwise we could end up in a tight busy loop.
#if _WIN32
              Sleep(0);
#else
              sched_yield();
#endif
            }

            // OK now we can take the original lock again.
            lock = targetExecutor->impl->state.lockExclusive();

            // OK, now we can wait for the other thread to either process our cancellation or
            // indicate that it is waiting for remote cancellation.
            lock.wait([&](const Executor::Impl::State& executorState) {
              return state == DONE || executorState.waitingForCancel;
            });
          }
        } else {
          // We have no executor of our own so we don't have to worry about cancellation cycles
          // causing deadlock.
          //
          // NOTE: I don't think we can actually get here, because it implies that this is a
          //   synchronous execution, which means there's no way to cancel it.
          lock.wait([&](auto&) { return state == DONE; });
        }
        KJ_DASSERT(!targetLink.isLinked());
        break;
      }
      case CANCELING:
        KJ_FAIL_ASSERT("impossible state: CANCELING should only be set within the above case");
      case DONE:
        // Became done while we waited for lock. Nothing to do.
        break;
    }